

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Cond<tcu::Vector<float,_4>_>::doApply
          (IRet *__return_storage_ptr__,Cond<tcu::Vector<float,_4>_> *this,EvalContext *param_1,
          IArgs *iargs)

{
  Interval *pIVar1;
  bool bVar2;
  IVal local_118;
  Interval local_b8;
  IVal local_a0;
  Interval local_40;
  IArgs *local_28;
  IArgs *iargs_local;
  EvalContext *param_1_local;
  Cond<tcu::Vector<float,_4>_> *this_local;
  IRet *ret;
  
  local_28 = iargs;
  iargs_local = (IArgs *)param_1;
  param_1_local = (EvalContext *)this;
  this_local = (Cond<tcu::Vector<float,_4>_> *)__return_storage_ptr__;
  tcu::Vector<tcu::Interval,_4>::Vector(__return_storage_ptr__);
  pIVar1 = local_28->a;
  tcu::Interval::Interval(&local_40,1.0);
  bVar2 = tcu::Interval::contains(pIVar1,&local_40);
  if (bVar2) {
    unionIVal<tcu::Vector<float,4>>
              (&local_a0,(BuiltinPrecisionTests *)__return_storage_ptr__,local_28->b,(IVal *)iargs);
    memcpy(__return_storage_ptr__,&local_a0,0x60);
  }
  pIVar1 = local_28->a;
  tcu::Interval::Interval(&local_b8,0.0);
  bVar2 = tcu::Interval::contains(pIVar1,&local_b8);
  if (bVar2) {
    unionIVal<tcu::Vector<float,4>>
              (&local_118,(BuiltinPrecisionTests *)__return_storage_ptr__,local_28->c,(IVal *)iargs)
    ;
    memcpy(__return_storage_ptr__,&local_118,0x60);
  }
  return __return_storage_ptr__;
}

Assistant:

IRet	doApply	(const EvalContext&, const IArgs& iargs)const
	{
		IRet	ret;

		if (iargs.a.contains(true))
			ret = unionIVal<T>(ret, iargs.b);

		if (iargs.a.contains(false))
			ret = unionIVal<T>(ret, iargs.c);

		return ret;
	}